

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O3

void Am_Start_Animator(Am_Object *interp,Am_Value *value1,Am_Value *value2)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object_Method method;
  Am_Object AStack_38;
  Am_Object local_30;
  Am_Object_Method local_28;
  
  pAVar2 = Am_Object::Get(interp,0xf7,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
  if (!bVar1) {
    Am_Object::Set(interp,0xf7,true,0);
    bVar1 = Am_Value::operator!=(value1,&Am_No_Value);
    if (bVar1) {
      Am_Object::Set(interp,0x181,value1,0);
      Am_Object::Set(interp,0x169,value1,0);
      Am_Object::Am_Object(&local_30,interp);
      Am_Set_Animated_Slots(&local_30);
      Am_Object::~Am_Object(&local_30);
    }
    bVar1 = Am_Value::operator!=(value2,&Am_No_Value);
    if (bVar1) {
      Am_Object::Set(interp,0x182,value2,0);
    }
    pAVar2 = Am_Object::Get(interp,199,0);
    Am_Object_Method::Am_Object_Method(&local_28,pAVar2);
    if (local_28.Call != (Am_Object_Method_Type *)0x0) {
      Am_Object::Am_Object(&AStack_38,interp);
      (*local_28.Call)((Am_Object_Data *)&AStack_38);
      Am_Object::~Am_Object(&AStack_38);
    }
  }
  return;
}

Assistant:

void
Am_Start_Animator(Am_Object interp, const Am_Value &value1,
                  const Am_Value &value2)
{
  if (static_cast<bool>(interp.Get(Am_RUNNING)) == true) {
    return;
  }

  interp.Set(Am_RUNNING, true);

  if (value1 != Am_No_Value) {
    interp.Set(Am_VALUE_1, value1);
    interp.Set(Am_VALUE, value1);
    Am_Set_Animated_Slots(interp); // reset the slots to value1
  }

  if (value2 != Am_No_Value) {
    interp.Set(Am_VALUE_2, value2);
  }

  Am_Object_Method method = interp.Get(Am_START_DO_METHOD);
  if (method.Valid()) {
    method.Call(interp);
  }

  return;
}